

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int __thiscall
TPZFMatrix<long>::Substitution(TPZFMatrix<long> *this,TPZFMatrix<long> *B,TPZVec<int> *index)

{
  char cVar1;
  long size;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long col;
  char *pcVar11;
  long lVar12;
  TPZVec<long> v;
  
  if (B == (TPZFMatrix<long> *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "virtual int TPZFMatrix<long>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long]"
                            );
    pcVar11 = "TPZFMatrix<>*B eh nulo";
LAB_00ca69bb:
    poVar3 = std::operator<<(poVar3,pcVar11);
  }
  else {
    cVar1 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fDecomposed;
    if (cVar1 != '\x02') {
      if (cVar1 == '\0') {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "virtual int TPZFMatrix<long>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long]"
                                );
        pcVar11 = anon_var_dwarf_2dfcec;
        goto LAB_00ca69bb;
      }
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "virtual int TPZFMatrix<long>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long]"
                              );
      poVar3 = std::operator<<(poVar3,"\nfDecomposed != ELUPivot");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    lVar4 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    size = index->fNElements;
    if ((size == (int)lVar4) && ((B->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow == size)) {
      lVar7 = (lVar4 << 0x20) + -0x100000000 >> 0x20;
      col = 0;
      lVar4 = 0;
      if (0 < size) {
        lVar4 = size;
      }
      lVar5 = (B->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
      if (lVar5 < 1) {
        lVar5 = col;
      }
      for (; col != lVar5; col = col + 1) {
        TPZVec<long>::TPZVec(&v,size);
        for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
          plVar6 = operator()(B,(long)index->fStore[lVar8],col);
          v.fStore[lVar8] = *plVar6;
        }
        for (lVar8 = 0; lVar9 = lVar7, lVar12 = lVar7 + 1, lVar8 != lVar4; lVar8 = lVar8 + 1) {
          lVar9 = 0;
          for (lVar12 = 0; lVar8 != lVar12; lVar12 = lVar12 + 1) {
            iVar2 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x21])(this,lVar8,lVar12);
            lVar9 = lVar9 + CONCAT44(extraout_var,iVar2) * v.fStore[lVar12];
          }
          v.fStore[lVar8] = v.fStore[lVar8] - lVar9;
        }
        for (; -1 < lVar9; lVar9 = lVar9 + -1) {
          lVar10 = 0;
          for (lVar8 = lVar12; lVar8 < size; lVar8 = lVar8 + 1) {
            iVar2 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x21])(this,lVar9,lVar8);
            lVar10 = lVar10 + CONCAT44(extraout_var_00,iVar2) * v.fStore[lVar8];
          }
          lVar8 = v.fStore[lVar9];
          iVar2 = (*(this->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
                    _vptr_TPZSavable[0x21])(this,lVar9,lVar9);
          v.fStore[lVar9] = (lVar8 - lVar10) / CONCAT44(extraout_var_01,iVar2);
          lVar12 = lVar12 + -1;
        }
        for (lVar8 = 0; lVar4 != lVar8; lVar8 = lVar8 + 1) {
          lVar9 = v.fStore[lVar8];
          plVar6 = operator()(B,lVar8,col);
          *plVar6 = lVar9;
        }
        TPZVec<long>::~TPZVec(&v);
      }
      return 1;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_2dfd0e);
    poVar3 = std::operator<<(poVar3,"this->fIndex = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
    poVar3 = std::operator<<(poVar3,"  b = ");
    poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  }
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B, const TPZVec<int> &index ) const{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    if (!this->fDecomposed){
        PZError <<  __PRETTY_FUNCTION__ << "Matriz não decomposta" << endl;
        return 0;
    }
    
    if (this->fDecomposed != ELUPivot){
        PZError << __PRETTY_FUNCTION__ << "\nfDecomposed != ELUPivot" << endl;
    }
    
    int nRows = this->Rows();
    
    if (index.NElements() != nRows || b.Rows() != nRows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t ncols = B->Cols();
    for(int64_t ic = 0; ic<ncols; ic++)
    {
        int64_t i,j;
        TVar sum = 0;
        
        TPZVec<TVar> v(nRows);
        
        
        for (i=0;i<nRows;i++)
        {
            v[i] = b(index[i],ic);
        }
        
        //Ly=b
        for (i=0;i<nRows;i++)
        {
            sum = 0.;
            for (j=0;j<(i);j++) sum +=this->Get(i,j) * v[j];
            v[i] -= sum;
        }
        
        //Ux=y
        for (i=(nRows-1);i>-1;i--)
        {
            sum = 0.;
            for (j=(i+1);j<nRows;j++) sum += this->Get(i,j) * v[j];
            v[i] = (v[i] - sum) / this->Get(i,i);
        }
        
        for (i=0;i<nRows;i++) b(i,ic) = v[i];
    }
    return 1;
}